

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcppacketbuilder.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPPacketBuilder::BuildBYEPacket
          (RTCPPacketBuilder *this,RTCPCompoundPacket **pack,void *reason,size_t reasonlength,
          bool useSRifpossible)

{
  uint32_t senderssrc;
  uint32_t uVar1;
  uint32_t packetcount;
  int iVar2;
  RTPMemoryManager *pRVar3;
  RTCPCompoundPacketBuilder *this_00;
  RTPSourceData *this_01;
  uint8_t *itemdata;
  double dVar4;
  uint32_t local_b4;
  uint8_t auStack_b0 [4];
  uint32_t ssrcs [1];
  size_t owncnamelen;
  uint8_t *owncname;
  RTPNTPTime ntptimestamp;
  uint32_t rtptimestamp;
  uint32_t tsdiff;
  RTPTime diff;
  uint32_t octetcount;
  uint32_t packcount;
  uint32_t rtppacktimestamp;
  RTPTime rtppacktime;
  RTPTime curtime;
  RTPSourceData *srcdat;
  bool useSR;
  uint32_t ssrc;
  int status;
  RTCPCompoundPacketBuilder *rtcpcomppack;
  size_t sStack_30;
  bool useSRifpossible_local;
  size_t reasonlength_local;
  void *reason_local;
  RTCPCompoundPacket **pack_local;
  RTCPPacketBuilder *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x32;
  }
  else {
    sStack_30 = reasonlength;
    if (0xff < reasonlength) {
      sStack_30 = 0xff;
    }
    *pack = (RTCPCompoundPacket *)0x0;
    pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    this_00 = (RTCPCompoundPacketBuilder *)operator_new(0x130,pRVar3,0x11);
    pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTCPCompoundPacketBuilder::RTCPCompoundPacketBuilder(this_00,pRVar3);
    if (this_00 == (RTCPCompoundPacketBuilder *)0x0) {
      this_local._4_4_ = -1;
    }
    else {
      this_local._4_4_ = RTCPCompoundPacketBuilder::InitBuild(this_00,this->maxpacketsize);
      if (this_local._4_4_ < 0) {
        pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
        RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
      }
      else {
        senderssrc = RTPPacketBuilder::GetSSRC(this->rtppacketbuilder);
        srcdat._7_1_ = false;
        if ((useSRifpossible) &&
           (this_01 = RTPSources::GetOwnSourceInfo(this->sources), this_01 != (RTPSourceData *)0x0))
        {
          srcdat._7_1_ = RTPSourceData::IsSender(this_01);
        }
        if (srcdat._7_1_ == false) {
          iVar2 = RTCPCompoundPacketBuilder::StartReceiverReport(this_00,senderssrc);
          if (iVar2 < 0) {
            pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
            RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
            if (iVar2 != -0x2b) {
              return iVar2;
            }
            return -0x33;
          }
        }
        else {
          rtppacktime = RTPTime::CurrentTime();
          _packcount = RTPPacketBuilder::GetPacketTime(this->rtppacketbuilder);
          uVar1 = RTPPacketBuilder::GetPacketTimestamp(this->rtppacketbuilder);
          packetcount = RTPPacketBuilder::GetPacketCount(this->rtppacketbuilder);
          diff.m_t._4_4_ = RTPPacketBuilder::GetPayloadOctetCount(this->rtppacketbuilder);
          _rtptimestamp = rtppacktime.m_t;
          RTPTime::operator-=((RTPTime *)&rtptimestamp,(RTPTime *)&packcount);
          dVar4 = RTPTime::GetDouble((RTPTime *)&rtptimestamp);
          ntptimestamp.lsw = (uint32_t)(long)(dVar4 / this->timestampunit + 0.5);
          ntptimestamp.msw = uVar1 + ntptimestamp.lsw;
          owncname = (uint8_t *)RTPTime::GetNTPTime(&rtppacktime);
          iVar2 = RTCPCompoundPacketBuilder::StartSenderReport
                            (this_00,senderssrc,(RTPNTPTime *)&owncname,ntptimestamp.msw,packetcount
                             ,diff.m_t._4_4_);
          if (iVar2 < 0) {
            pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
            RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
            if (iVar2 != -0x2b) {
              return iVar2;
            }
            return -0x33;
          }
        }
        itemdata = RTCPSDESInfo::GetCNAME
                             (&(this->ownsdesinfo).super_RTCPSDESInfo,(size_t *)auStack_b0);
        this_local._4_4_ = RTCPCompoundPacketBuilder::AddSDESSource(this_00,senderssrc);
        if (this_local._4_4_ < 0) {
          pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
          RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
          if (this_local._4_4_ == -0x2b) {
            this_local._4_4_ = -0x33;
          }
        }
        else {
          this_local._4_4_ =
               RTCPCompoundPacketBuilder::AddSDESNormalItem(this_00,CNAME,itemdata,auStack_b0[0]);
          if (this_local._4_4_ < 0) {
            pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
            RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
            if (this_local._4_4_ == -0x2b) {
              this_local._4_4_ = -0x33;
            }
          }
          else {
            local_b4 = senderssrc;
            this_local._4_4_ =
                 RTCPCompoundPacketBuilder::AddBYEPacket
                           (this_00,&local_b4,'\x01',reason,(uint8_t)sStack_30);
            if (this_local._4_4_ < 0) {
              pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
              RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
              if (this_local._4_4_ == -0x2b) {
                this_local._4_4_ = -0x33;
              }
            }
            else {
              this_local._4_4_ = RTCPCompoundPacketBuilder::EndBuild(this_00);
              if (this_local._4_4_ < 0) {
                pRVar3 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
                RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,pRVar3);
              }
              else {
                *pack = (RTCPCompoundPacket *)this_00;
                this_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTCPPacketBuilder::BuildBYEPacket(RTCPCompoundPacket **pack,const void *reason,size_t reasonlength,bool useSRifpossible)
{
	if (!init)
		return ERR_RTP_RTCPPACKETBUILDER_NOTINIT;

	RTCPCompoundPacketBuilder *rtcpcomppack;
	int status;
	
	if (reasonlength > 255)
		reasonlength = 255;
	
	*pack = 0;
	
	rtcpcomppack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPCOMPOUNDPACKETBUILDER) RTCPCompoundPacketBuilder(GetMemoryManager());
	if (rtcpcomppack == 0)
		return ERR_RTP_OUTOFMEM;
	
	if ((status = rtcpcomppack->InitBuild(maxpacketsize)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		return status;
	}
	
	uint32_t ssrc = rtppacketbuilder.GetSSRC();
	bool useSR = false;
	
	if (useSRifpossible)
	{
		RTPSourceData *srcdat;
		
		if ((srcdat = sources.GetOwnSourceInfo()) != 0)
		{
			if (srcdat->IsSender())
				useSR = true;
		}
	}
			
	if (useSR)
	{
		RTPTime curtime = RTPTime::CurrentTime();
		RTPTime rtppacktime = rtppacketbuilder.GetPacketTime();
		uint32_t rtppacktimestamp = rtppacketbuilder.GetPacketTimestamp();
		uint32_t packcount = rtppacketbuilder.GetPacketCount();
		uint32_t octetcount = rtppacketbuilder.GetPayloadOctetCount();
		RTPTime diff = curtime;
		diff -= rtppacktime;
		
		uint32_t tsdiff = (uint32_t)((diff.GetDouble()/timestampunit)+0.5);
		uint32_t rtptimestamp = rtppacktimestamp+tsdiff;
		RTPNTPTime ntptimestamp = curtime.GetNTPTime();

		if ((status = rtcpcomppack->StartSenderReport(ssrc,ntptimestamp,rtptimestamp,packcount,octetcount)) < 0)
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
			return status;
		}
	}
	else
	{
		if ((status = rtcpcomppack->StartReceiverReport(ssrc)) < 0)
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
			return status;
		}
	}

	uint8_t *owncname;
	size_t owncnamelen;

	owncname = ownsdesinfo.GetCNAME(&owncnamelen);

	if ((status = rtcpcomppack->AddSDESSource(ssrc)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
			return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
		return status;
	}
	if ((status = rtcpcomppack->AddSDESNormalItem(RTCPSDESPacket::CNAME,owncname,owncnamelen)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
			return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
		return status;
	}

	uint32_t ssrcs[1];

	ssrcs[0] = ssrc;
	
	if ((status = rtcpcomppack->AddBYEPacket(ssrcs,1,(const uint8_t *)reason,reasonlength)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
			return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
		return status;
	}
	
	if ((status = rtcpcomppack->EndBuild()) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		return status;
	}

	*pack = rtcpcomppack;
	return 0;
}